

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void compute_coherence_metrics<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  pointer *ppfVar1;
  iterator __position;
  pointer pfVar2;
  iterator __position_00;
  unsigned_long uVar3;
  lda *plVar4;
  long lVar5;
  pointer pwVar6;
  pointer pvVar7;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  _Var8;
  _Rb_tree_node_base *p_Var9;
  mapped_type *pmVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  ulong uVar14;
  long lVar15;
  _Hash_node_base *p_Var16;
  ulong uVar17;
  pointer puVar18;
  pointer pfVar19;
  pointer pvVar20;
  pointer pwVar21;
  pointer puVar22;
  pointer pvVar23;
  pointer puVar24;
  pointer puVar25;
  feature_pair *pairs;
  __node_base *p_Var26;
  vector<feature_pair,_std::allocator<feature_pair>_> *this;
  pointer puVar27;
  ulong uVar28;
  _Base_ptr p_Var29;
  _Base_ptr p_Var30;
  __node_base *p_Var31;
  ulong uVar32;
  pointer puVar33;
  float fVar34;
  undefined4 uVar35;
  float fVar36;
  initializer_list<word_doc_frequency> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> top_features_idx;
  anon_class_1_0_00000001 cmp;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  coWordsDFSet;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> vec;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  topics_word_pairs;
  pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_d8;
  __node_base *local_b0;
  allocator_type local_a1;
  lda *local_a0;
  pointer local_98;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  local_90;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> local_60;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  local_48;
  
  uVar14 = 1L << ((byte)l->all->num_bits & 0x3f);
  local_48.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::resize(&local_48,l->topics);
  local_a0 = l;
  if (l->topics != 0) {
    p_Var26 = &(weights->_map)._M_h._M_before_begin;
    uVar17 = 10;
    if (uVar14 < 10) {
      uVar17 = uVar14;
    }
    lVar5 = uVar17 + (uVar17 == 0);
    uVar14 = 0;
    local_b0 = p_Var26;
    do {
      local_d8.first = 0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                        *)&local_90,(anon_class_1_0_00000001 *)&local_98,
                       (vector<feature,_std::allocator<feature>_> *)&local_d8);
      lVar15 = lVar5;
      p_Var31 = p_Var26;
      if ((void *)local_d8.first != (void *)0x0) {
        operator_delete((void *)local_d8.first);
      }
      do {
        p_Var31 = p_Var31->_M_nxt;
        local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
        _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var31 + 1);
        local_d8.first =
             CONCAT44(local_d8.first._4_4_,
                      *(undefined4 *)
                       ((long)&(*(_Hash_node_base **)
                                 &((_Prime_rehash_policy *)(p_Var31 + 2))->_M_max_load_factor)->
                               _M_nxt + uVar14 * 4));
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                *)&local_90,(value_type *)&local_d8);
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      for (p_Var16 = p_Var26->_M_nxt; p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt)
      {
        fVar36 = *(float *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + uVar14 * 4);
        if (*(float *)local_90._M_impl._0_8_ <= fVar36 && fVar36 != *(float *)local_90._M_impl._0_8_
           ) {
          std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
          ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                 *)&local_90);
          local_d8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var16[1]._M_nxt;
          local_d8.first =
               CONCAT44(local_d8.first._4_4_,
                        *(undefined4 *)((long)&(p_Var16[2]._M_nxt)->_M_nxt + uVar14 * 4));
          std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
          ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                  *)&local_90,(value_type *)&local_d8);
        }
      }
      local_d8.first = 0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                 CONCAT44(local_90._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_90._M_impl.super__Rb_tree_header._M_header._M_color) -
                 local_90._M_impl._0_8_ >> 4);
      for (uVar17 = (ulong)(CONCAT44(local_90._M_impl.super__Rb_tree_header._M_header._4_4_,
                                     local_90._M_impl.super__Rb_tree_header._M_header._M_color) -
                           local_90._M_impl._0_8_) >> 4 & 0xffffffff; 0 < (int)uVar17;
          uVar17 = uVar17 - 1) {
        *(undefined8 *)(local_d8.first + uVar17 * 8 + -8) =
             *(undefined8 *)(local_90._M_impl._0_8_ + 8);
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
               *)&local_90);
      }
      pwVar21 = (pointer)local_d8.first;
      if (local_d8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)local_d8.first) {
        this = local_48.
               super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14;
        pwVar6 = local_d8.second.
                 super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar17 = 0;
        do {
          uVar32 = uVar17 + 1;
          uVar11 = (long)pwVar6 - (long)pwVar21 >> 3;
          uVar28 = uVar32;
          if (uVar32 < uVar11) {
            do {
              local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)(&pwVar21->idx)[uVar17];
              local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)(&pwVar21->idx)[uVar28];
              pwVar21 = local_60.
                        super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pwVar6 = local_60.
                       super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              __position._M_current =
                   (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<feature_pair,_std::allocator<feature_pair>_>::
                _M_realloc_insert<feature_pair>(this,__position,(feature_pair *)&local_60);
              }
              else {
                local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                     (undefined4)
                     ((ulong)local_60.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x20);
                local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                     (undefined4)
                     ((ulong)local_60.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
                *(undefined4 *)&(__position._M_current)->f1 =
                     local_60.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f1 + 4) =
                     local_60.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_;
                *(undefined4 *)&(__position._M_current)->f2 =
                     local_60.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f2 + 4) =
                     local_60.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_4_;
                ppfVar1 = &(this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppfVar1 = *ppfVar1 + 1;
                local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start = pwVar21;
                local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_finish = pwVar6;
              }
              uVar28 = uVar28 + 1;
              uVar11 = (long)((long)local_d8.second.
                                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                    ._M_impl.super__Vector_impl_data._M_start - local_d8.first) >> 3
              ;
              pwVar6 = local_d8.second.
                       super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pwVar21 = (pointer)local_d8.first;
            } while (uVar28 < uVar11);
          }
          uVar17 = uVar32;
        } while (uVar32 < uVar11);
      }
      if (pwVar21 != (pointer)0x0) {
        operator_delete(pwVar21);
      }
      plVar4 = local_a0;
      p_Var26 = local_b0;
      if ((float *)local_90._M_impl._0_8_ != (float *)0x0) {
        operator_delete((void *)local_90._M_impl._0_8_);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < plVar4->topics);
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = (__node_base *)
             local_48.
             super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_48.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar7 = local_48.
             super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pfVar2 = (pvVar7->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar19 = (pvVar7->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                     _M_impl.super__Vector_impl_data._M_start; pfVar19 != pfVar2;
          pfVar19 = pfVar19 + 1) {
        pwVar21 = (pointer)pfVar19->f1;
        local_98 = (pointer)pfVar19->f2;
        if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001af22c:
          local_d8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)local_d8.second.
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_d8;
          local_d8.first = (unsigned_long)local_98;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_60,__l,&local_a1);
          local_d8.first = (unsigned_long)pwVar21;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_d8.second,&local_60);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
                      *)&local_90,&local_d8);
          if (local_d8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.second.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          p_Var12 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var30 = &local_90._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var29 = p_Var30;
            p_Var13 = p_Var12;
            pwVar6 = *(pointer *)(p_Var13 + 1);
            p_Var30 = p_Var13;
            if (pwVar6 < pwVar21) {
              p_Var30 = p_Var29;
            }
            p_Var12 = (&p_Var13->_M_left)[pwVar6 < pwVar21];
          } while ((&p_Var13->_M_left)[pwVar6 < pwVar21] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var30 == &local_90._M_impl.super__Rb_tree_header)
          goto LAB_001af22c;
          if (pwVar6 < pwVar21) {
            p_Var13 = p_Var29;
          }
          if (pwVar21 < *(pointer *)(p_Var13 + 1)) goto LAB_001af22c;
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_1_>>
                            (p_Var30[1]._M_parent,p_Var30[1]._M_left,&local_98);
          pwVar21 = local_d8.second.
                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          __position_00._M_current = (word_doc_frequency *)p_Var30[1]._M_left;
          if (_Var8._M_current != __position_00._M_current) {
            local_d8.first = (unsigned_long)local_98;
            uVar3 = local_d8.first;
            local_d8.second.
            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_d8.second.
                                  super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            pwVar6 = local_d8.second.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((_Base_ptr)__position_00._M_current == p_Var30[1]._M_right) {
              std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::
              _M_realloc_insert<word_doc_frequency>
                        ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                         &p_Var30[1]._M_parent,__position_00,(word_doc_frequency *)&local_d8);
            }
            else {
              local_d8.first._0_4_ = SUB84(local_98,0);
              local_d8.first._4_4_ = (undefined4)((ulong)local_98 >> 0x20);
              local_d8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = SUB84(pwVar21,4);
              *(undefined4 *)&(__position_00._M_current)->idx = (undefined4)local_d8.first;
              *(undefined4 *)((long)&(__position_00._M_current)->idx + 4) = local_d8.first._4_4_;
              (__position_00._M_current)->count = 0;
              *(undefined4 *)&(__position_00._M_current)->field_0xc =
                   local_d8.second.
                   super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_;
              p_Var30[1]._M_left = (_Base_ptr)&(p_Var30[1]._M_left)->_M_left;
              local_d8.first = uVar3;
              local_d8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start = pwVar6;
            }
          }
        }
      }
      pvVar7 = pvVar7 + 1;
      p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (pvVar7 != (pointer)local_b0);
    for (; (_Rb_tree_header *)p_Var9 != &local_90._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      p_Var12 = p_Var9[1]._M_parent;
      p_Var30 = p_Var9[1]._M_left;
      if (p_Var12 != p_Var30) {
        pvVar20 = (local_a0->feature_to_example_map).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var9 + 1);
        puVar18 = (pvVar20->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar22 = *(pointer *)
                   ((long)&(pvVar20->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data + 8);
        puVar25 = puVar18;
        puVar24 = puVar22;
        do {
          puVar33 = puVar18;
          if (puVar24 != puVar18) {
            pvVar23 = (local_a0->feature_to_example_map).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var12;
            puVar27 = (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar33 = puVar24;
            if (*(pointer *)
                 ((long)&(pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data + 8) != puVar27) {
              uVar14 = 0;
              uVar17 = 0;
              puVar24 = puVar18;
              puVar18 = puVar25;
              do {
                if (puVar24[uVar14] == puVar27[uVar17]) {
                  *(int *)&p_Var12->_M_parent = *(int *)&p_Var12->_M_parent + 1;
                  uVar14 = uVar14 + 1;
                  uVar17 = uVar17 + 1;
                  puVar18 = (pvVar20->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  puVar22 = *(pointer *)
                             ((long)&(pvVar20->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data + 8);
                }
                else if (puVar27[uVar17] < puVar24[uVar14]) {
                  uVar17 = uVar17 + 1;
                }
                else {
                  uVar14 = uVar14 + 1;
                }
                puVar25 = puVar18;
                puVar33 = puVar22;
              } while ((uVar14 < (ulong)((long)puVar22 - (long)puVar18 >> 3)) &&
                      (puVar27 = (pvVar23->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start, puVar24 = puVar18,
                      uVar17 < (ulong)((long)*(pointer *)
                                              ((long)&(pvVar23->
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                       (long)puVar27 >> 3)));
            }
          }
          p_Var12 = (_Base_ptr)&p_Var12->_M_left;
          puVar24 = puVar33;
        } while (p_Var12 != p_Var30);
      }
    }
  }
  plVar4 = local_a0;
  if (local_a0->topics == 0) {
    uVar35 = 0;
  }
  else {
    local_b0 = (__node_base *)((ulong)local_b0 & 0xffffffff00000000);
    uVar14 = 0;
    do {
      pfVar19 = local_48.
                super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14].
                super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar2 = local_48.
               super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
               super__Vector_impl_data._M_finish;
      fVar36 = 0.0;
      if (pfVar19 != pfVar2) {
        fVar36 = 0.0;
        do {
          local_d8.first = pfVar19->f1;
          if ((plVar4->feature_counts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[local_d8.first] != 0) {
            local_60.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pfVar19->f2;
            pmVar10 = std::
                      map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                      ::operator[]((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                                    *)&local_90,&local_d8.first);
            _Var8 = std::
                    __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_2_>>
                              ((pmVar10->
                               super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (pmVar10->
                               super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                               )._M_impl.super__Vector_impl_data._M_finish,&local_60);
            if (_Var8._M_current !=
                (pmVar10->
                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
              fVar34 = logf(((float)(_Var8._M_current)->count + 1e-06) /
                            (float)(plVar4->feature_counts).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[local_d8.first]);
              fVar36 = fVar36 + fVar34;
            }
          }
          pfVar19 = pfVar19 + 1;
        } while (pfVar19 != pfVar2);
      }
      printf("Topic %3d coherence: %f\n",SUB84((double)fVar36,0),uVar14 & 0xffffffff);
      fVar36 = local_b0._0_4_ + fVar36;
      local_b0 = (__node_base *)CONCAT44(local_b0._4_4_,fVar36);
      uVar14 = uVar14 + 1;
    } while (uVar14 < plVar4->topics);
    uVar35 = SUB84((double)(fVar36 / (float)plVar4->topics),0);
  }
  printf("Avg topic coherence: %f\n",uVar35);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void compute_coherence_metrics(lda &l, T &weights)
{
  uint64_t length = (uint64_t)1 << l.all->num_bits;

  std::vector<std::vector<feature_pair>> topics_word_pairs;
  topics_word_pairs.resize(l.topics);

  int top_words_count = 10;  // parameterize and check

  for (size_t topic = 0; topic < l.topics; topic++)
  {
    // get top features for this topic
    auto cmp = [](feature &left, feature &right) { return left.x > right.x; };
    std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
    typename T::iterator iter = weights.begin();
    for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
      top_features.push(feature((&(*iter))[topic], iter.index()));

    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if ((&(*v))[topic] > top_features.top().x)
      {
        top_features.pop();
        top_features.push(feature((&(*v))[topic], v.index()));
      }

    // extract idx and sort descending
    vector<uint64_t> top_features_idx;
    top_features_idx.resize(top_features.size());
    for (int i = (int)top_features.size() - 1; i >= 0; i--)
    {
      top_features_idx[i] = top_features.top().weight_index;
      top_features.pop();
    }

    auto &word_pairs = topics_word_pairs[topic];
    for (size_t i = 0; i < top_features_idx.size(); i++)
      for (size_t j = i + 1; j < top_features_idx.size(); j++)
        word_pairs.push_back(feature_pair(top_features_idx[i], top_features_idx[j]));
  }

  // compress word pairs and create record for storing frequency
  std::map<uint64_t, std::vector<word_doc_frequency>> coWordsDFSet;
  for (auto &vec : topics_word_pairs)
  {
    for (auto &wp : vec)
    {
      auto f1 = wp.f1;
      auto f2 = wp.f2;
      auto wdf = coWordsDFSet.find(f1);

      if (wdf != coWordsDFSet.end())
      {
        // http://stackoverflow.com/questions/5377434/does-stdmapiterator-return-a-copy-of-value-or-a-value-itself
        // if (wdf->second.find(f2) == wdf->second.end())

        if (std::find_if(wdf->second.begin(), wdf->second.end(),
                [&f2](const word_doc_frequency &v) { return v.idx == f2; }) != wdf->second.end())
        {
          wdf->second.push_back({f2, 0});
          // printf(" add %d %d\n", f1, f2);
        }
      }
      else
      {
        std::vector<word_doc_frequency> vec = {{f2, 0}};
        coWordsDFSet.insert(std::make_pair(f1, vec));
        // printf(" insert %d %d\n", f1, f2);
      }
    }
  }

  // this.GetWordPairsDocumentFrequency(coWordsDFSet);
  for (auto &pair : coWordsDFSet)
  {
    auto &examples_for_f1 = l.feature_to_example_map[pair.first];
    for (auto &wdf : pair.second)
    {
      auto &examples_for_f2 = l.feature_to_example_map[wdf.idx];

      // assumes examples_for_f1 and examples_for_f2 are orderd
      size_t i = 0;
      size_t j = 0;
      while (i < examples_for_f1.size() && j < examples_for_f2.size())
      {
        if (examples_for_f1[i] == examples_for_f2[j])
        {
          wdf.count++;
          i++;
          j++;
        }
        else if (examples_for_f2[j] < examples_for_f1[i])
          j++;
        else
          i++;
      }
    }
  }

  float epsilon = 1e-6f;  // TODO
  float avg_coherence = 0;
  for (size_t topic = 0; topic < l.topics; topic++)
  {
    float coherence = 0;

    for (auto &pairs : topics_word_pairs[topic])
    {
      auto f1 = pairs.f1;
      if (l.feature_counts[f1] == 0)
        continue;

      auto f2 = pairs.f2;
      auto &co_feature = coWordsDFSet[f1];
      auto co_feature_df = std::find_if(
          co_feature.begin(), co_feature.end(), [&f2](const word_doc_frequency &v) { return v.idx == f2; });

      if (co_feature_df != co_feature.end())
      {
        // printf("(%d:%d + eps)/(%d:%d)\n", f2, co_feature_df->count, f1, l.feature_counts[f1]);
        coherence += logf((co_feature_df->count + epsilon) / l.feature_counts[f1]);
      }
    }

    printf("Topic %3d coherence: %f\n", (int)topic, coherence);

    // TODO: expose per topic coherence

    // TODO: good vs. bad topics
    avg_coherence += coherence;
  }

  avg_coherence /= l.topics;

  printf("Avg topic coherence: %f\n", avg_coherence);
}